

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall embree::ISPCQuadMesh::~ISPCQuadMesh(ISPCQuadMesh *this)

{
  ISPCGeometry *in_RDI;
  size_t i_1;
  size_t i;
  ulong local_18;
  ulong local_10;
  
  if (*(long *)(in_RDI + 1) != 0) {
    for (local_10 = 0; local_10 < in_RDI[2].materialID; local_10 = local_10 + 1) {
      alignedUSMFree((void *)0x18ea2c);
    }
    alignedUSMFree((void *)0x18ea4e);
  }
  if (in_RDI[1].geometry != (RTCGeometry)0x0) {
    for (local_18 = 0; local_18 < in_RDI[2].materialID; local_18 = local_18 + 1) {
      alignedUSMFree((void *)0x18ea90);
    }
    alignedUSMFree((void *)0x18eab2);
  }
  alignedUSMFree((void *)0x18eac4);
  alignedUSMFree((void *)0x18ead4);
  ISPCGeometry::~ISPCGeometry(in_RDI);
  return;
}

Assistant:

ISPCQuadMesh::~ISPCQuadMesh ()
  {
    if (positions) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(positions[i]);
      alignedUSMFree(positions);
    }
    
    if (normals) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(normals[i]);
      alignedUSMFree(normals);
    }

    alignedUSMFree(texcoords);
    alignedUSMFree(quads);
  }